

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O1

void __thiscall APowerInvulnerable::DoEffect(APowerInvulnerable *this)

{
  double *pdVar1;
  byte *pbVar2;
  ActorFlags2 *pAVar3;
  bool bVar4;
  int iVar5;
  AActor *pAVar6;
  double dVar7;
  
  APowerup::DoEffect(&this->super_APowerup);
  pAVar6 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
  if (pAVar6 != (AActor *)0x0) {
    bVar4 = true;
    if (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_004a2e88;
    (this->super_APowerup).super_AInventory.Owner.field_0.p = (AActor *)0x0;
  }
  bVar4 = false;
LAB_004a2e88:
  if ((bVar4) && ((this->super_APowerup).Mode.super_FName.Index == 0x11)) {
    pAVar6 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
    if (((pAVar6->flags).Value & 0x40000) == 0) {
      pAVar6->RenderStyle = LegacyRenderStyles[6];
      iVar5 = level.time;
      if ((((level.time & 7U) == 0) &&
          (0.0 < ((this->super_APowerup).super_AInventory.Owner.field_0.p)->Alpha)) &&
         (pdVar1 = &((this->super_APowerup).super_AInventory.Owner.field_0.p)->Alpha,
         *pdVar1 <= 1.0 && *pdVar1 != 1.0)) {
        pAVar6 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
        if ((pAVar6->Alpha != 0.59375) || (NAN(pAVar6->Alpha))) {
          pAVar6->Alpha = 0.0;
          pAVar3 = &((this->super_APowerup).super_AInventory.Owner.field_0.p)->flags2;
          pAVar3->Value = pAVar3->Value | 0x4000000;
        }
        else {
          pAVar6->Alpha = 0.40625;
        }
      }
      if ((iVar5 & 0x1fU) == 0) {
        pAVar6 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
        if ((pAVar6->Alpha != 0.0) || (NAN(pAVar6->Alpha))) {
          dVar7 = 0.59375;
        }
        else {
          pbVar2 = (byte *)((long)&(pAVar6->flags2).Value + 3);
          *pbVar2 = *pbVar2 & 0xfb;
          pAVar6 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
          dVar7 = 0.40625;
        }
        pAVar6->Alpha = dVar7;
      }
    }
    else {
      pbVar2 = (byte *)((long)&(pAVar6->flags2).Value + 3);
      *pbVar2 = *pbVar2 & 0xfb;
    }
  }
  return;
}

Assistant:

void APowerInvulnerable::DoEffect ()
{
	Super::DoEffect ();

	if (Owner == NULL)
	{
		return;
	}

	if (Mode == NAME_Ghost)
	{
		if (!(Owner->flags & MF_SHADOW))
		{
			// Don't mess with the translucency settings if an
			// invisibility powerup is active.
			Owner->RenderStyle = STYLE_Translucent;
			if (!(level.time & 7) && Owner->Alpha > 0 && Owner->Alpha < 1)
			{
				if (Owner->Alpha == HX_SHADOW)
				{
					Owner->Alpha = HX_ALTSHADOW;
				}
				else
				{
					Owner->Alpha = 0;
					Owner->flags2 |= MF2_NONSHOOTABLE;
				}
			}
			if (!(level.time & 31))
			{
				if (Owner->Alpha == 0)
				{
					Owner->flags2 &= ~MF2_NONSHOOTABLE;
					Owner->Alpha = HX_ALTSHADOW;
				}
				else
				{
					Owner->Alpha = HX_SHADOW;
				}
			}
		}
		else
		{
			Owner->flags2 &= ~MF2_NONSHOOTABLE;
		}
	}
}